

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_str.cpp
# Opt level: O3

void test_string_view<char16_t>(void)

{
  long lVar1;
  size_t *psVar2;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *pbVar3;
  AssertionHandler catchAssertionHandler;
  SourceLineInfo local_178;
  BinaryExpr<const_frozen::basic_string<char16_t>_&,_const_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_&>
  local_168;
  AssertionHandler local_138;
  char16_t *local_f0;
  size_t local_e8;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> local_e0;
  basic_string<char16_t> local_d0;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> local_b8;
  basic_string<char16_t> local_a8;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  psVar2 = &DAT_001d06a8;
  pbVar3 = &local_e0;
  for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
    pbVar3->_M_len = *psVar2;
    psVar2 = psVar2 + 1;
    pbVar3 = (basic_string_view<char16_t,_std::char_traits<char16_t>_> *)&pbVar3->_M_str;
  }
  local_f0 = L"Let it go !";
  local_e8 = 0xb;
  local_168.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x194095;
  local_168.super_ITransientExpression.m_isBinaryExpression = true;
  local_168.super_ITransientExpression.m_result = false;
  local_168.super_ITransientExpression._10_6_ = 0;
  local_178.file =
       "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/tests/test_str.cpp"
  ;
  local_178.line = 0x43;
  Catch::StringRef::StringRef(&local_40,"letItGo == letitgo");
  Catch::AssertionHandler::AssertionHandler
            (&local_138,(StringRef *)&local_168,&local_178,local_40,Normal);
  local_178.file = (char *)&local_f0;
  Catch::ExprLhs<frozen::basic_string<char16_t>const&>::operator==
            ((BinaryExpr<const_frozen::basic_string<char16_t>_&,_const_char16_t_(&)[12]> *)
             &local_168,(ExprLhs<frozen::basic_string<char16_t>const&> *)&local_178,
             (char16_t (*) [12])L"Let it go !");
  Catch::AssertionHandler::handleExpr(&local_138,&local_168.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_168.super_ITransientExpression);
  Catch::AssertionHandler::complete(&local_138);
  if (local_138.m_completed == false) {
    (*(local_138.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_168.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x194095;
  local_168.super_ITransientExpression.m_isBinaryExpression = true;
  local_168.super_ITransientExpression.m_result = false;
  local_168.super_ITransientExpression._10_6_ = 0;
  local_178.file =
       "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/tests/test_str.cpp"
  ;
  local_178.line = 0x44;
  Catch::StringRef::StringRef(&local_50,"letItGo == letitgo_s");
  Catch::AssertionHandler::AssertionHandler
            (&local_138,(StringRef *)&local_168,&local_178,local_50,Normal);
  local_178.file = (char *)&local_f0;
  Catch::ExprLhs<frozen::basic_string<char16_t>const&>::operator==
            ((BinaryExpr<const_frozen::basic_string<char16_t>_&,_const_frozen::basic_string<char16_t>_&>
              *)&local_168,(ExprLhs<frozen::basic_string<char16_t>const&> *)&local_178,&local_a8);
  Catch::AssertionHandler::handleExpr(&local_138,&local_168.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_168.super_ITransientExpression);
  Catch::AssertionHandler::complete(&local_138);
  if (local_138.m_completed == false) {
    (*(local_138.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_168.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x194095;
  local_168.super_ITransientExpression.m_isBinaryExpression = true;
  local_168.super_ITransientExpression.m_result = false;
  local_168.super_ITransientExpression._10_6_ = 0;
  local_178.file =
       "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/tests/test_str.cpp"
  ;
  local_178.line = 0x45;
  Catch::StringRef::StringRef(&local_60,"letItGo == letitgo_sv");
  Catch::AssertionHandler::AssertionHandler
            (&local_138,(StringRef *)&local_168,&local_178,local_60,Normal);
  local_178.file = (char *)&local_f0;
  Catch::ExprLhs<frozen::basic_string<char16_t>const&>::operator==
            (&local_168,(ExprLhs<frozen::basic_string<char16_t>const&> *)&local_178,&local_b8);
  Catch::AssertionHandler::handleExpr(&local_138,&local_168.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_168.super_ITransientExpression);
  Catch::AssertionHandler::complete(&local_138);
  if (local_138.m_completed == false) {
    (*(local_138.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_f0 = local_e0._M_str;
  local_e8 = local_e0._M_len;
  local_168.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x194095;
  local_168.super_ITransientExpression.m_isBinaryExpression = true;
  local_168.super_ITransientExpression.m_result = false;
  local_168.super_ITransientExpression._10_6_ = 0;
  local_178.file =
       "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/tests/test_str.cpp"
  ;
  local_178.line = 0x48;
  Catch::StringRef::StringRef(&local_70,"letItGo == letitgoletitgo");
  Catch::AssertionHandler::AssertionHandler
            (&local_138,(StringRef *)&local_168,&local_178,local_70,Normal);
  local_178.file = (char *)&local_f0;
  Catch::ExprLhs<frozen::basic_string<char16_t>const&>::operator==
            ((BinaryExpr<const_frozen::basic_string<char16_t>_&,_const_char16_t_(&)[23]> *)
             &local_168,(ExprLhs<frozen::basic_string<char16_t>const&> *)&local_178,
             (char16_t (*) [23])L"Let it go, let it go !");
  Catch::AssertionHandler::handleExpr(&local_138,&local_168.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_168.super_ITransientExpression);
  Catch::AssertionHandler::complete(&local_138);
  if (local_138.m_completed == false) {
    (*(local_138.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_168.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x194095;
  local_168.super_ITransientExpression.m_isBinaryExpression = true;
  local_168.super_ITransientExpression.m_result = false;
  local_168.super_ITransientExpression._10_6_ = 0;
  local_178.file =
       "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/tests/test_str.cpp"
  ;
  local_178.line = 0x49;
  Catch::StringRef::StringRef(&local_80,"letItGo == letitgoletitgo_s");
  Catch::AssertionHandler::AssertionHandler
            (&local_138,(StringRef *)&local_168,&local_178,local_80,Normal);
  local_178.file = (char *)&local_f0;
  Catch::ExprLhs<frozen::basic_string<char16_t>const&>::operator==
            ((BinaryExpr<const_frozen::basic_string<char16_t>_&,_const_frozen::basic_string<char16_t>_&>
              *)&local_168,(ExprLhs<frozen::basic_string<char16_t>const&> *)&local_178,&local_d0);
  Catch::AssertionHandler::handleExpr(&local_138,&local_168.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_168.super_ITransientExpression);
  Catch::AssertionHandler::complete(&local_138);
  if (local_138.m_completed == false) {
    (*(local_138.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_168.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x194095;
  local_168.super_ITransientExpression.m_isBinaryExpression = true;
  local_168.super_ITransientExpression.m_result = false;
  local_168.super_ITransientExpression._10_6_ = 0;
  local_178.file =
       "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/tests/test_str.cpp"
  ;
  local_178.line = 0x4a;
  Catch::StringRef::StringRef(&local_90,"letItGo == letitgoletitgo_sv");
  Catch::AssertionHandler::AssertionHandler
            (&local_138,(StringRef *)&local_168,&local_178,local_90,Normal);
  local_178.file = (char *)&local_f0;
  Catch::ExprLhs<frozen::basic_string<char16_t>const&>::operator==
            (&local_168,(ExprLhs<frozen::basic_string<char16_t>const&> *)&local_178,&local_e0);
  Catch::AssertionHandler::handleExpr(&local_138,&local_168.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_168.super_ITransientExpression);
  Catch::AssertionHandler::complete(&local_138);
  if (local_138.m_completed == false) {
    (*(local_138.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  return;
}

Assistant:

void test_string_view() {
#ifdef FROZEN_LETITGO_HAS_STRING_VIEW
  constexpr auto strings = []() -> std::tuple<
    const Char(&)[12], frozen::basic_string<Char>, std::basic_string_view<Char>,
    const Char(&)[23], frozen::basic_string<Char>, std::basic_string_view<Char>
  > {
    if constexpr (std::is_same_v<char, Char>) {
      return {
        "Let it go !", "Let it go !"_s, "Let it go !"sv,
        "Let it go, let it go !", "Let it go, let it go !"_s, "Let it go, let it go !"sv
      };
    } else if constexpr (std::is_same_v<wchar_t, Char>) {
      return {
        L"Let it go !", L"Let it go !"_s, L"Let it go !"sv,
        L"Let it go, let it go !", L"Let it go, let it go !"_s, L"Let it go, let it go !"sv
      };
    } else if constexpr (std::is_same_v<char16_t, Char>) {
      return {
        u"Let it go !", u"Let it go !"_s, u"Let it go !"sv,
        u"Let it go, let it go !", u"Let it go, let it go !"_s, u"Let it go, let it go !"sv
      };
    } else if constexpr (std::is_same_v<char32_t, Char>) {
      return {
        U"Let it go !", U"Let it go !"_s, U"Let it go !"sv,
        U"Let it go, let it go !", U"Let it go, let it go !"_s, U"Let it go, let it go !"sv
      };
    }
#ifdef FROZEN_LETITGO_HAS_CHAR8T
    else if constexpr (std::is_same_v<char8_t, Char>) {
      return {
        u8"Let it go !", u8"Let it go !"_s, u8"Let it go !"sv,
        u8"Let it go, let it go !", u8"Let it go, let it go !"_s, u8"Let it go, let it go !"sv
      };
    }
#endif
  }();
  
  const auto [
    letitgo,
    letitgo_s,
    letitgo_sv,
    letitgoletitgo,
    letitgoletitgo_s,
    letitgoletitgo_sv
  ] = strings;

  {
    frozen::basic_string<Char> letItGo = letitgo_sv;
    REQUIRE(letItGo == letitgo);
    REQUIRE(letItGo == letitgo_s);
    REQUIRE(letItGo == letitgo_sv);

    letItGo = letitgoletitgo_sv;
    REQUIRE(letItGo == letitgoletitgo);
    REQUIRE(letItGo == letitgoletitgo_s);
    REQUIRE(letItGo == letitgoletitgo_sv);
  }

  {
    constexpr frozen::basic_string<Char> letItGo = std::get<2>(strings);
    static_assert(letItGo == std::get<0>(strings), "frozen::string constexpr");
    static_assert(letItGo == std::get<1>(strings), "frozen::string constexpr literal");
    static_assert(letItGo == std::get<2>(strings), "frozen::string constexpr string view");
  }
#endif
}